

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>::
addSearchTerm(DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              *this,GlobalBrokerId *searchValue,string_view existingValue)

{
  byte bVar1;
  iterator iVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false,_false>,_bool>
  pVar3;
  key_type local_20;
  
  local_20._M_str = existingValue._M_str;
  local_20._M_len = existingValue._M_len;
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->lookup1,&local_20);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar1 = 0;
  }
  else {
    pVar3 = std::
            _Hashtable<helics::GlobalBrokerId,std::pair<helics::GlobalBrokerId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalBrokerId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalBrokerId>,std::hash<helics::GlobalBrokerId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<helics::GlobalBrokerId_const&,unsigned_long&>
                      ((_Hashtable<helics::GlobalBrokerId,std::pair<helics::GlobalBrokerId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalBrokerId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalBrokerId>,std::hash<helics::GlobalBrokerId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->lookup2,searchValue,
                       (long)iVar2.
                             super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x18);
    bVar1 = pVar3.second;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

auto addSearchTerm(
            const searchType2& searchValue,
            std::string_view existingValue)
        {
            auto fnd = lookup1.find(existingValue);
            if (fnd != lookup1.end()) {
                auto res = lookup2.emplace(searchValue, fnd->second);
                return res.second;
            }
            return false;
        }